

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::Swap(Reflection *this,Message *message1,Message *message2)

{
  undefined4 uVar1;
  pointer pUVar2;
  pointer pUVar3;
  pointer pUVar4;
  pointer pUVar5;
  int iVar6;
  uint uVar7;
  LogMessage *pLVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Message *message2_00;
  ulong uVar9;
  ulong uVar10;
  UnknownFieldSet *pUVar11;
  Reflection *extraout_RDX;
  Reflection *extraout_RDX_00;
  long lVar12;
  long lVar13;
  ulong uVar14;
  UnknownFieldSet *pUVar15;
  long lVar16;
  LogFinisher local_99;
  LogMessage local_98;
  LogMessage local_60;
  undefined4 extraout_var_01;
  
  if (message1 != message2) {
    (*(message1->super_MessageLite)._vptr_MessageLite[0x15])(message1);
    if (extraout_RDX != this) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x25c);
      pLVar8 = internal::LogMessage::operator<<
                         (&local_60,"CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar8 = internal::LogMessage::operator<<(pLVar8,"First argument to Swap() (of type \"");
      iVar6 = (*(message1->super_MessageLite)._vptr_MessageLite[0x15])(message1);
      pLVar8 = internal::LogMessage::operator<<
                         (pLVar8,*(string **)(CONCAT44(extraout_var,iVar6) + 8));
      pLVar8 = internal::LogMessage::operator<<
                         (pLVar8,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar8 = internal::LogMessage::operator<<(pLVar8,*(string **)(this->descriptor_ + 8));
      pLVar8 = internal::LogMessage::operator<<
                         (pLVar8,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar8);
      internal::LogMessage::~LogMessage(&local_60);
    }
    (*(message2->super_MessageLite)._vptr_MessageLite[0x15])(message2);
    if (extraout_RDX_00 != this) {
      internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x264);
      pLVar8 = internal::LogMessage::operator<<
                         (&local_98,"CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar8 = internal::LogMessage::operator<<(pLVar8,"Second argument to Swap() (of type \"");
      iVar6 = (*(message2->super_MessageLite)._vptr_MessageLite[0x15])(message2);
      pLVar8 = internal::LogMessage::operator<<
                         (pLVar8,*(string **)(CONCAT44(extraout_var_00,iVar6) + 8));
      pLVar8 = internal::LogMessage::operator<<
                         (pLVar8,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar8 = internal::LogMessage::operator<<(pLVar8,*(string **)(this->descriptor_ + 8));
      pLVar8 = internal::LogMessage::operator<<
                         (pLVar8,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=(&local_99,pLVar8);
      internal::LogMessage::~LogMessage(&local_98);
    }
    uVar10 = (ulong)(uint)(this->schema_).metadata_offset_;
    uVar9 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar10);
    uVar14 = uVar9;
    if ((uVar9 & 1) != 0) {
      uVar14 = *(ulong *)((uVar9 & 0xfffffffffffffffe) + 0x18);
    }
    uVar10 = *(ulong *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar10);
    if ((uVar10 & 1) != 0) {
      uVar10 = *(ulong *)((uVar10 & 0xfffffffffffffffe) + 0x18);
    }
    if (uVar14 == uVar10) {
      if ((this->schema_).has_bits_offset_ != -1) {
        lVar12 = (long)*(int *)(this->descriptor_ + 0x68);
        if (lVar12 < 1) {
          iVar6 = 0;
        }
        else {
          lVar16 = *(long *)(this->descriptor_ + 0x28);
          lVar13 = 0;
          iVar6 = 0;
          do {
            if (*(int *)(lVar16 + 0x3c + lVar13) != 3) {
              iVar6 = iVar6 + (uint)(*(long *)(lVar16 + 0x58 + lVar13) == 0);
            }
            lVar13 = lVar13 + 0x98;
          } while (lVar12 * 0x98 - lVar13 != 0);
        }
        if (0 < iVar6) {
          uVar9 = (ulong)(uint)(this->schema_).has_bits_offset_;
          uVar7 = iVar6 + 0x1fU >> 5;
          uVar14 = 1;
          if (1 < uVar7) {
            uVar14 = (ulong)uVar7;
          }
          uVar10 = 0;
          do {
            uVar1 = *(undefined4 *)
                     ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar10 * 4 + uVar9);
            *(undefined4 *)
             ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar10 * 4 + uVar9) =
                 *(undefined4 *)
                  ((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar10 * 4 + uVar9);
            *(undefined4 *)
             ((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar10 * 4 + uVar9) = uVar1;
            uVar10 = uVar10 + 1;
          } while (uVar14 != uVar10);
        }
      }
      if (-1 < this->last_non_weak_field_index_) {
        lVar12 = -1;
        lVar16 = 0;
        do {
          if (*(long *)(*(long *)(this->descriptor_ + 0x28) + 0x58 + lVar16) == 0) {
            SwapField(this,message1,message2,
                      (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x28) + lVar16));
          }
          lVar12 = lVar12 + 1;
          lVar16 = lVar16 + 0x98;
        } while (lVar12 < this->last_non_weak_field_index_);
      }
      iVar6 = *(int *)(this->descriptor_ + 0x6c);
      if (0 < (long)iVar6) {
        lVar12 = 0;
        do {
          SwapOneofField(this,message1,message2,
                         (OneofDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar12));
          lVar12 = lVar12 + 0x30;
        } while ((long)iVar6 * 0x30 != lVar12);
      }
      if ((this->schema_).extensions_offset_ != -1) {
        uVar9 = (ulong)(uint)(this->schema_).extensions_offset_;
        internal::ExtensionSet::Swap
                  ((ExtensionSet *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar9),
                   (ExtensionSet *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar9))
        ;
      }
      uVar14 = (ulong)(uint)(this->schema_).metadata_offset_;
      uVar9 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar14);
      if ((uVar9 & 1) == 0) {
        pUVar15 = internal::
                  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  ::mutable_unknown_fields_slow
                            ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar14));
      }
      else {
        pUVar15 = (UnknownFieldSet *)(uVar9 & 0xfffffffffffffffe);
      }
      uVar14 = (ulong)(uint)(this->schema_).metadata_offset_;
      uVar9 = *(ulong *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar14);
      if ((uVar9 & 1) == 0) {
        pUVar11 = internal::
                  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  ::mutable_unknown_fields_slow
                            ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar14));
      }
      else {
        pUVar11 = (UnknownFieldSet *)(uVar9 & 0xfffffffffffffffe);
      }
      pUVar2 = (pUVar15->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pUVar3 = (pUVar11->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pUVar4 = (pUVar15->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pUVar5 = (pUVar15->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (pUVar15->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pUVar11->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pUVar15->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish = pUVar3;
      (pUVar15->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pUVar11->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pUVar11->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start = pUVar4;
      (pUVar11->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish = pUVar5;
      (pUVar11->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pUVar2;
    }
    else {
      if ((uVar9 & 1) != 0) {
        uVar9 = *(ulong *)((uVar9 & 0xfffffffffffffffe) + 0x18);
      }
      iVar6 = (*(message1->super_MessageLite)._vptr_MessageLite[4])(message1,uVar9);
      message2_00 = (Message *)CONCAT44(extraout_var_01,iVar6);
      (*(message2_00->super_MessageLite)._vptr_MessageLite[0x11])(message2_00,message2);
      (*(message2->super_MessageLite)._vptr_MessageLite[0x10])(message2,message1);
      Swap(this,message1,message2_00);
      uVar9 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                        (ulong)(uint)(this->schema_).metadata_offset_);
      if ((uVar9 & 1) != 0) {
        uVar9 = *(ulong *)((uVar9 & 0xfffffffffffffffe) + 0x18);
      }
      if (uVar9 == 0) {
        (*(message2_00->super_MessageLite)._vptr_MessageLite[1])(message2_00);
      }
    }
  }
  return;
}

Assistant:

void Reflection::Swap(Message* message1, Message* message2) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
      << "First argument to Swap() (of type \""
      << message1->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
      << "Second argument to Swap() (of type \""
      << message2->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  // Check that both messages are in the same arena (or both on the heap). We
  // need to copy all data if not, due to ownership semantics.
  if (GetArena(message1) != GetArena(message2)) {
    // Slow copy path.
    // Use our arena as temp space, if available.
    Message* temp = message1->New(GetArena(message1));
    temp->MergeFrom(*message2);
    message2->CopyFrom(*message1);
    Swap(message1, temp);
    if (GetArena(message1) == nullptr) {
      delete temp;
    }
    return;
  }

  if (schema_.HasHasbits()) {
    uint32* has_bits1 = MutableHasBits(message1);
    uint32* has_bits2 = MutableHasBits(message2);

    int fields_with_has_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->is_repeated() || field->containing_oneof()) {
        continue;
      }
      fields_with_has_bits++;
    }

    int has_bits_size = (fields_with_has_bits + 31) / 32;

    for (int i = 0; i < has_bits_size; i++) {
      std::swap(has_bits1[i], has_bits2[i]);
    }
  }

  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->containing_oneof()) continue;
    SwapField(message1, message2, field);
  }
  const int oneof_decl_count = descriptor_->oneof_decl_count();
  for (int i = 0; i < oneof_decl_count; i++) {
    SwapOneofField(message1, message2, descriptor_->oneof_decl(i));
  }

  if (schema_.HasExtensionSet()) {
    MutableExtensionSet(message1)->Swap(MutableExtensionSet(message2));
  }

  MutableUnknownFields(message1)->Swap(MutableUnknownFields(message2));
}